

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall Tokenizer::tryToGetSingleCharToken(Tokenizer *this)

{
  char cVar1;
  Mark *pMVar2;
  Stream *in_RDI;
  Mark mark;
  Token *in_stack_fffffffffffffb68;
  Token *pTVar3;
  Token *in_stack_fffffffffffffb70;
  Mark *in_stack_fffffffffffffb78;
  string *in_stack_fffffffffffffb80;
  string *value;
  TokenType *in_stack_fffffffffffffb88;
  allocator<char> *paVar4;
  Token *in_stack_fffffffffffffb90;
  allocator<char> *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_431 [37];
  undefined4 local_40c;
  undefined1 local_3c9 [37];
  undefined4 local_3a4;
  undefined8 local_361;
  undefined4 local_33c;
  undefined1 local_2f9 [37];
  undefined4 local_2d4;
  allocator<char> local_291;
  string local_290 [36];
  undefined4 local_26c;
  undefined1 local_229 [37];
  undefined4 local_204;
  allocator<char> local_1c1;
  string local_1c0 [36];
  undefined4 local_19c;
  allocator<char> local_159;
  string local_158 [36];
  undefined4 local_134;
  allocator<char> local_f1;
  string local_f0 [36];
  undefined4 local_cc;
  undefined1 local_79 [37];
  undefined4 local_54;
  Mark local_18;
  
  pMVar2 = Stream::getMark(in_RDI);
  local_18 = *pMVar2;
  cVar1 = Stream::peek((Stream *)0x1942d6);
  switch(cVar1) {
  case '%':
    local_3a4 = 0xf;
    in_stack_fffffffffffffb70 = (Token *)local_3c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Token::Token(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
    Token::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Token::~Token((Token *)0x194ad3);
    std::__cxx11::string::~string((string *)(local_3c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3c9);
    break;
  default:
    return false;
  case '(':
    local_204 = 0x29;
    pTVar3 = (Token *)local_229;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Token::Token(pTVar3,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
    Token::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Token::~Token((Token *)0x19472b);
    std::__cxx11::string::~string((string *)(local_229 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_229);
    break;
  case ')':
    local_26c = 0x2a;
    paVar4 = &local_291;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Token::Token(in_stack_fffffffffffffb90,(TokenType *)paVar4,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
    Token::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Token::~Token((Token *)0x194815);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator(&local_291);
    break;
  case ',':
    local_54 = 0x2f;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Token::Token(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
    Token::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Token::~Token((Token *)0x194383);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    break;
  case ':':
    local_cc = 0x2d;
    paVar4 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,(char *)paVar4,in_stack_fffffffffffffba0);
    Token::Token(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
    Token::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Token::~Token((Token *)0x19446d);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    break;
  case ';':
    local_134 = 0x2e;
    paVar4 = &local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,paVar4);
    Token::Token(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
    Token::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Token::~Token((Token *)0x194557);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator(&local_159);
    break;
  case '\\':
    local_19c = 0x30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Token::Token(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
    Token::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Token::~Token((Token *)0x194641);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    break;
  case '{':
    local_2d4 = 0x2b;
    value = (string *)local_2f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Token::Token(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,value,in_stack_fffffffffffffb78
                );
    Token::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Token::~Token((Token *)0x1948ff);
    std::__cxx11::string::~string((string *)(local_2f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2f9);
    break;
  case '}':
    local_33c = 0x2c;
    pMVar2 = (Mark *)&local_361;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Token::Token(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 pMVar2);
    Token::operator=(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    Token::~Token((Token *)0x1949e9);
    std::__cxx11::string::~string((string *)((long)&local_361 + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    break;
  case '~':
    local_40c = 0x1e;
    pTVar3 = (Token *)local_431;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    Token::Token(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
    Token::operator=(in_stack_fffffffffffffb70,pTVar3);
    Token::~Token((Token *)0x194bb2);
    std::__cxx11::string::~string((string *)(local_431 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_431);
  }
  Stream::advance((Stream *)in_stack_fffffffffffffb70);
  return true;
}

Assistant:

bool Tokenizer::tryToGetSingleCharToken()
{
  const Mark mark = stream_.getMark();
  switch(stream_.peek())
  {
    case ',':
      token_ = Token{TokenType::Comma, ",", mark};
      break;
    case ':':
      token_ = Token{TokenType::Colon, ":", mark};
      break;
    case ';':
      token_ = Token{TokenType::Semicolon, ";", mark};
      break;
    case '\\':
      token_ = Token{TokenType::Backslash, "\\", mark};
      break;
    case '(':
      token_ = Token{TokenType::LParen, "(", mark};
      break;
    case ')':
      token_ = Token{TokenType::RParen, ")", mark};
      break;
    case '{':
      token_ = Token{TokenType::LBrace, "{", mark};
      break;
    case '}':
      token_ = Token{TokenType::RBrace, "}", mark};
      break;
    case '%':
      token_ = Token{TokenType::Modulo, "%", mark};
      break;
    case '~':
      token_ = Token{TokenType::BinaryNot, "~", mark};
      break;
    default:
      return false;
  }
  stream_.advance();
  return true;
}